

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild.cpp
# Opt level: O3

int __thiscall
FNodeBuilder::SelectSplitter
          (FNodeBuilder *this,DWORD set,node_t *node,DWORD *splitseg,int step,bool nosplit)

{
  byte bVar1;
  uchar *puVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  byte bVar8;
  byte bVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  FPrivSeg *pseg;
  uint local_48;
  
  uVar11 = (ulong)set;
  uVar12 = 0;
  memset((this->PlaneChecked).Array,0,(ulong)(this->PlaneChecked).Count);
  if (set != 0xffffffff) {
    local_48 = 0xffffffff;
    iVar4 = 0;
    iVar13 = 0;
    bVar8 = 0;
    bVar9 = 0;
    do {
      pseg = (this->Segs).Array + uVar11;
      iVar5 = iVar4 + -1;
      bVar3 = iVar4 < 2;
      iVar4 = iVar5;
      iVar5 = iVar13;
      uVar12 = local_48;
      if (bVar3) {
        uVar10 = pseg->planenum >> 3;
        uVar7 = 1 << ((byte)pseg->planenum & 7);
        if (-1 < (int)uVar10) {
          puVar2 = (this->PlaneChecked).Array;
          bVar1 = puVar2[uVar10];
          if ((uVar7 & bVar1) != 0) goto LAB_004f7f72;
          puVar2[uVar10] = (byte)uVar7 | bVar1;
        }
        SetNodeFromSeg(this,node,pseg);
        iVar6 = Heuristic(this,node,set,nosplit);
        iVar4 = step;
        iVar5 = iVar6;
        uVar12 = (uint)uVar11;
        if ((iVar6 <= iVar13) && (iVar5 = iVar13, bVar9 = bVar8, uVar12 = local_48, iVar6 < 0)) {
          bVar8 = 1;
          bVar9 = 1;
        }
      }
LAB_004f7f72:
      local_48 = uVar12;
      iVar13 = iVar5;
      uVar11 = (ulong)pseg->next;
    } while (pseg->next != 0xffffffff);
    if (local_48 != 0xffffffff) {
      *splitseg = local_48;
      SetNodeFromSeg(this,node,(this->Segs).Array + local_48);
      return 1;
    }
    uVar12 = (uint)bVar9;
  }
  return -uVar12;
}

Assistant:

int FNodeBuilder::SelectSplitter (DWORD set, node_t &node, DWORD &splitseg, int step, bool nosplit)
{
	int stepleft;
	int bestvalue;
	DWORD bestseg;
	DWORD seg;
	bool nosplitters = false;

	bestvalue = 0;
	bestseg = DWORD_MAX;

	seg = set;
	stepleft = 0;

	memset (&PlaneChecked[0], 0, PlaneChecked.Size());

	D(Printf (PRINT_LOG, "Processing set %d\n", set));

	while (seg != DWORD_MAX)
	{
		FPrivSeg *pseg = &Segs[seg];

		if (--stepleft <= 0)
		{
			int l = pseg->planenum >> 3;
			int r = 1 << (pseg->planenum & 7);

			if (l < 0 || (PlaneChecked[l] & r) == 0)
			{
				if (l >= 0)
				{
					PlaneChecked[l] |= r;
				}

				stepleft = step;
				SetNodeFromSeg (node, pseg);

				int value = Heuristic (node, set, nosplit);

				D(Printf (PRINT_LOG, "Seg %5d, ld %d (%5d,%5d)-(%5d,%5d) scores %d\n", seg, Segs[seg].linedef, node.x>>16, node.y>>16,
					(node.x+node.dx)>>16, (node.y+node.dy)>>16, value));

				if (value > bestvalue)
				{
					bestvalue = value;
					bestseg = seg;
				}
				else if (value < 0)
				{
					nosplitters = true;
				}
			}
		}

		seg = pseg->next;
	}

	if (bestseg == DWORD_MAX)
	{ // No lines split any others into two sets, so this is a convex region.
	D(Printf (PRINT_LOG, "set %d, step %d, nosplit %d has no good splitter (%d)\n", set, step, nosplit, nosplitters));
		return nosplitters ? -1 : 0;
	}

	D(Printf (PRINT_LOG, "split seg %u in set %d, score %d, step %d, nosplit %d\n", bestseg, set, bestvalue, step, nosplit));

	splitseg = bestseg;
	SetNodeFromSeg (node, &Segs[bestseg]);
	return 1;
}